

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::AssignmentExpression::serializeTo(AssignmentExpression *this,ASTSerializer *serializer)

{
  bool bVar1;
  Expression *pEVar2;
  ASTSerializer *in_RSI;
  AssignmentExpression *in_RDI;
  string_view sVar3;
  ASTSerializer *in_stack_ffffffffffffff68;
  ASTSerializer *this_00;
  int local_70;
  void *local_68;
  size_t local_60;
  int local_50;
  void *local_48;
  int local_40;
  void *local_38;
  int local_30;
  void *local_28;
  int local_20;
  void *local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff68);
  pEVar2 = left(in_RDI);
  ASTSerializer::write(this_00,local_20,local_18,(size_t)pEVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_ffffffffffffff68);
  pEVar2 = right(in_RDI);
  ASTSerializer::write(in_RSI,local_30,local_28,(size_t)pEVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_ffffffffffffff68);
  bVar1 = isNonBlocking(in_RDI);
  ASTSerializer::write(in_RSI,local_40,local_38,(ulong)bVar1);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::BinaryOperator> *)0x9c566e);
  if (bVar1) {
    in_stack_ffffffffffffff68 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    std::optional<slang::ast::BinaryOperator>::operator*
              ((optional<slang::ast::BinaryOperator> *)0x9c56a0);
    sVar3 = ast::toString(Add);
    local_60 = sVar3._M_len;
    ASTSerializer::write(in_stack_ffffffffffffff68,local_50,local_48,local_60);
  }
  if (in_RDI->timingControl != (TimingControl *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff68);
    ASTSerializer::write(in_RSI,local_70,local_68,(size_t)in_RDI->timingControl);
  }
  return;
}

Assistant:

void AssignmentExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());
    serializer.write("right", right());
    serializer.write("isNonBlocking", isNonBlocking());
    if (op)
        serializer.write("op", toString(*op));
    if (timingControl)
        serializer.write("timingControl", *timingControl);
}